

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.cpp
# Opt level: O2

string * db_change_to_string_abi_cxx11_(string *__return_storage_ptr__,DbChangeType change)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(change) {
  case Insert:
    __s = "INSERT";
    __a = &local_9;
    break;
  case Drop:
    __s = "DROP";
    __a = &local_a;
    break;
  case Reload:
    __s = "RELOAD";
    __a = &local_b;
    break;
  case ToggleTaint:
    __s = "TOGGLE_TAINT";
    __a = &local_d;
    break;
  case NewIterator:
    __s = "NEW_ITERATOR";
    __a = &local_e;
    break;
  case UpdateIterator:
    __s = "UPDATE_ITERATOR";
    __a = &local_f;
    break;
  case ConfigChange:
    __s = "CONFIG_CHANGE";
    __a = &local_c;
    break;
  default:
    __s = "<invalid?>";
    __a = &local_10;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string db_change_to_string(DbChangeType change) {
    switch (change) {
        case DbChangeType::Insert:
            return "INSERT";
        case DbChangeType::Drop:
            return "DROP";
        case DbChangeType::Reload:
            return "RELOAD";
        case DbChangeType::ConfigChange:
            return "CONFIG_CHANGE";
        case DbChangeType::ToggleTaint:
            return "TOGGLE_TAINT";
        case DbChangeType::NewIterator:
            return "NEW_ITERATOR";
        case DbChangeType::UpdateIterator:
            return "UPDATE_ITERATOR";
    }
    return "<invalid?>";
}